

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

SurfaceFaceColorQuantity * __thiscall
polyscope::SurfaceMesh::addFaceColorQuantityImpl
          (SurfaceMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colors)

{
  SurfaceFaceColorQuantity *pSVar1;
  string *in_RSI;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_RDI;
  bool in_stack_00000047;
  string *in_stack_00000048;
  QuantityStructure<polyscope::SurfaceMesh> *in_stack_00000050;
  SurfaceFaceColorQuantity *q;
  string local_70 [7];
  undefined1 in_stack_ffffffffffffff97;
  QuantityType *in_stack_ffffffffffffff98;
  QuantityStructure<polyscope::SurfaceMesh> *in_stack_ffffffffffffffa0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffb8;
  SurfaceMesh *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  SurfaceFaceColorQuantity *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RSI);
  QuantityStructure<polyscope::SurfaceMesh>::checkForQuantityWithNameAndDeleteOrError
            (in_stack_00000050,in_stack_00000048,in_stack_00000047);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  pSVar1 = (SurfaceFaceColorQuantity *)operator_new(0x2d8);
  std::__cxx11::string::string(local_70,in_RSI);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_ffffffffffffffa0,
           (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_ffffffffffffff98);
  SurfaceFaceColorQuantity::SurfaceFaceColorQuantity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(in_RDI);
  std::__cxx11::string::~string(local_70);
  QuantityStructure<polyscope::SurfaceMesh>::addQuantity
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  return pSVar1;
}

Assistant:

SurfaceFaceColorQuantity* SurfaceMesh::addFaceColorQuantityImpl(std::string name,
                                                                const std::vector<glm::vec3>& colors) {
  checkForQuantityWithNameAndDeleteOrError(name);
  SurfaceFaceColorQuantity* q = new SurfaceFaceColorQuantity(name, *this, colors);
  addQuantity(q);
  return q;
}